

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O0

void __thiscall irr::gui::CGUITabControl::draw(CGUITabControl *this)

{
  bool bVar1;
  u32 uVar2;
  int iVar3;
  uint uVar4;
  IGUITab **ppIVar5;
  undefined4 extraout_var;
  ulong uVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar7;
  long in_RDI;
  rect<int> textClipRect_1;
  rect<int> textClipRect;
  s32 space;
  s32 len;
  wchar_t *text;
  u32 i;
  IGUITab *activeTab;
  s32 right;
  s32 left;
  bool needRightScroll;
  bool needLeftScroll;
  s32 pos;
  rect<int> tr;
  rect<int> frameRect;
  IVideoDriver *driver;
  IGUIFont *font;
  IGUISkin *skin;
  rect<int> *in_stack_fffffffffffffe58;
  rect<int> *prVar8;
  vector2d<int> *pvVar9;
  undefined4 uVar10;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  wchar_t *in_stack_fffffffffffffe68;
  IGUIElement *pIVar11;
  IGUIFont *in_stack_fffffffffffffe70;
  CGUITabControl *in_stack_fffffffffffffe78;
  undefined8 *puVar12;
  IGUIElement *in_stack_fffffffffffffe80;
  uint uVar13;
  uint in_stack_fffffffffffffeb4;
  undefined1 local_120 [36];
  uint local_fc;
  uint local_f8;
  int local_f4;
  undefined1 local_f0 [36];
  rect<int> local_cc;
  int local_bc;
  undefined1 local_b8 [32];
  rect<int> local_98;
  rect<int> local_88;
  int local_78;
  int local_74;
  undefined8 local_70;
  uint local_64;
  IGUITab *local_60;
  int local_54;
  int local_50;
  byte local_4a;
  byte local_49;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  uint local_34;
  vector2d<int> local_30;
  vector2d<int> local_28;
  IGUIElement *local_20;
  undefined8 *local_18;
  long *local_10;
  
  if (((*(byte *)(in_RDI + 0xa0) & 1) != 0) &&
     (local_10 = (long *)(**(code **)(**(long **)(in_RDI + 0x128) + 0x60))(),
     local_10 != (long *)0x0)) {
    local_18 = (undefined8 *)(**(code **)(*local_10 + 0x30))(local_10,0);
    local_20 = (IGUIElement *)(**(code **)(**(long **)(in_RDI + 0x128) + 0x30))();
    local_30 = *(vector2d<int> *)(in_RDI + 0x40);
    local_28 = *(vector2d<int> *)(in_RDI + 0x48);
    bVar1 = core::array<irr::gui::IGUITab_*>::empty((array<irr::gui::IGUITab_*> *)0x3d0892);
    pIVar11 = local_20;
    if (bVar1) {
      local_34 = (**(code **)*local_10)(local_10,3);
      (*(pIVar11->super_IEventReceiver)._vptr_IEventReceiver[0x33])
                (pIVar11,(ulong)local_34,&local_30,in_RDI + 0x50);
    }
    if (local_18 != (undefined8 *)0x0) {
      if (*(int *)(in_RDI + 0x164) == 0) {
        local_30.Y = local_30.Y + 2;
        local_28.Y = local_30.Y + *(int *)(in_RDI + 0x160);
      }
      else {
        local_30.Y = (local_28.Y - *(int *)(in_RDI + 0x160)) + -1;
        local_28.Y = local_28.Y + -2;
      }
      core::rect<int>::rect
                ((rect<int> *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
      local_48 = local_30.X + 2;
      local_49 = 0 < *(int *)(in_RDI + 0x17c);
      local_4a = 0;
      local_50 = 0;
      local_54 = 0;
      local_60 = (IGUITab *)0x0;
      local_64 = *(uint *)(in_RDI + 0x17c);
      while( true ) {
        uVar13 = local_64;
        uVar2 = core::array<irr::gui::IGUITab_*>::size((array<irr::gui::IGUITab_*> *)0x3d09e5);
        uVar4 = in_stack_fffffffffffffeb4 & 0xffffff;
        if (uVar13 < uVar2) {
          uVar4 = CONCAT13(local_4a,(int3)in_stack_fffffffffffffeb4) ^ 0xff000000;
        }
        in_stack_fffffffffffffeb4 = uVar4;
        if ((in_stack_fffffffffffffeb4 & 0x1000000) == 0) break;
        local_70 = 0;
        ppIVar5 = core::array<irr::gui::IGUITab_*>::operator[]
                            ((array<irr::gui::IGUITab_*> *)
                             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                             (u32)((ulong)in_stack_fffffffffffffe58 >> 0x20));
        if (*ppIVar5 != (IGUITab *)0x0) {
          ppIVar5 = core::array<irr::gui::IGUITab_*>::operator[]
                              ((array<irr::gui::IGUITab_*> *)
                               CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                               (u32)((ulong)in_stack_fffffffffffffe58 >> 0x20));
          iVar3 = (*((*ppIVar5)->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x15])
                            ();
          local_70 = CONCAT44(extraout_var,iVar3);
        }
        local_74 = calcTabWidth(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                                in_stack_fffffffffffffe68);
        if ((*(byte *)(in_RDI + 0x15e) & 1) != 0) {
          local_88 = IGUIElement::getAbsolutePosition(*(IGUIElement **)(in_RDI + 0x168));
          local_78 = (local_88.UpperLeftCorner.X + -2) - local_48;
          if (local_78 < local_74) {
            local_4a = 1;
            local_74 = local_78;
          }
        }
        local_30.X = local_48;
        local_28.Y = local_28.Y;
        local_28.X = local_48 + local_74;
        if (local_64 == *(uint *)(in_RDI + 0x158)) {
          local_50 = local_48;
          local_54 = local_48 + local_74;
          local_48 = local_74 + local_48;
          ppIVar5 = core::array<irr::gui::IGUITab_*>::operator[]
                              ((array<irr::gui::IGUITab_*> *)
                               CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                               (u32)((ulong)in_stack_fffffffffffffe58 >> 0x20));
          local_60 = *ppIVar5;
        }
        else {
          local_48 = local_74 + local_48;
          (**(code **)(*local_10 + 0x90))
                    (local_10,in_RDI,0,&local_30,in_RDI + 0x50,*(undefined4 *)(in_RDI + 0x164));
          local_98.UpperLeftCorner = local_30;
          local_98.LowerRightCorner = local_28;
          core::rect<int>::clipAgainst(&local_98,(rect<int> *)(in_RDI + 0x50));
          puVar12 = local_18;
          core::string<wchar_t>::string<wchar_t>
                    ((string<wchar_t> *)
                     CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                     (wchar_t *)in_stack_fffffffffffffe58);
          ppIVar5 = core::array<irr::gui::IGUITab_*>::operator[]
                              ((array<irr::gui::IGUITab_*> *)
                               CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                               (u32)((ulong)in_stack_fffffffffffffe58 >> 0x20));
          local_bc = (*((*ppIVar5)->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver
                       [0x29])();
          in_stack_fffffffffffffe58 = &local_98;
          (**(code **)*puVar12)(puVar12,local_b8,&local_30,local_bc,1);
          core::string<wchar_t>::~string((string<wchar_t> *)0x3d0c90);
        }
        local_64 = local_64 + 1;
      }
      if (((local_50 == 0) || (local_54 == 0)) || (local_60 == (IGUITab *)0x0)) {
        local_44 = *(int *)(in_RDI + 0x40);
        local_3c = *(undefined4 *)(in_RDI + 0x48);
        local_40 = local_28.Y + -1;
        local_38 = local_28.Y;
        if (*(int *)(in_RDI + 0x164) == 0) {
          pIVar11 = local_20;
          uVar4 = (**(code **)*local_10)(local_10,3);
          uVar10 = (undefined4)((ulong)in_stack_fffffffffffffe58 >> 0x20);
          (*(pIVar11->super_IEventReceiver)._vptr_IEventReceiver[0x33])
                    (pIVar11,(ulong)uVar4,&local_44,in_RDI + 0x50);
        }
        else {
          local_40 = local_30.Y + -1;
          local_38 = local_30.Y;
          pIVar11 = local_20;
          uVar4 = (**(code **)*local_10)(local_10,0);
          uVar10 = (undefined4)((ulong)in_stack_fffffffffffffe58 >> 0x20);
          (*(pIVar11->super_IEventReceiver)._vptr_IEventReceiver[0x33])
                    (pIVar11,(ulong)uVar4,&local_44,in_RDI + 0x50);
        }
      }
      else if (*(int *)(in_RDI + 0x164) == 0) {
        local_28.X = local_54 + 2;
        local_30.Y = local_30.Y + -2;
        local_30.X = local_50 + -2;
        (**(code **)(*local_10 + 0x90))
                  (local_10,in_RDI,1,&local_30,in_RDI + 0x50,*(undefined4 *)(in_RDI + 0x164));
        local_cc.UpperLeftCorner = local_30;
        local_cc.LowerRightCorner = local_28;
        core::rect<int>::clipAgainst(&local_cc,(rect<int> *)(in_RDI + 0x50));
        puVar12 = local_18;
        (*(local_60->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x15])();
        core::string<wchar_t>::string<wchar_t>
                  ((string<wchar_t> *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                   (wchar_t *)in_stack_fffffffffffffe58);
        local_f4 = (*(local_60->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x29])
                             ();
        prVar8 = &local_cc;
        (**(code **)*puVar12)(puVar12,local_f0,&local_30,local_f4,1,1,prVar8);
        uVar10 = (undefined4)((ulong)prVar8 >> 0x20);
        core::string<wchar_t>::~string((string<wchar_t> *)0x3d0e08);
        pIVar11 = local_20;
        local_44 = *(int *)(in_RDI + 0x40);
        local_3c = local_50 + -1;
        local_40 = local_28.Y + -1;
        local_38 = local_28.Y;
        local_f8 = (**(code **)*local_10)(local_10,3);
        (*(pIVar11->super_IEventReceiver)._vptr_IEventReceiver[0x33])
                  (pIVar11,(ulong)local_f8,&local_44,in_RDI + 0x50);
        pIVar11 = local_20;
        local_44 = local_54;
        local_3c = *(undefined4 *)(in_RDI + 0x48);
        local_fc = (**(code **)*local_10)(local_10,3);
        (*(pIVar11->super_IEventReceiver)._vptr_IEventReceiver[0x33])
                  (pIVar11,(ulong)local_fc,&local_44,in_RDI + 0x50);
      }
      else {
        local_30.X = local_50 + -2;
        local_28.Y = local_28.Y + 2;
        local_28.X = local_54 + 2;
        (**(code **)(*local_10 + 0x90))
                  (local_10,in_RDI,1,&local_30,in_RDI + 0x50,*(undefined4 *)(in_RDI + 0x164));
        puVar12 = local_18;
        (*(local_60->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x15])();
        core::string<wchar_t>::string<wchar_t>
                  ((string<wchar_t> *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                   (wchar_t *)in_stack_fffffffffffffe58);
        iVar3 = (*(local_60->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x29])();
        pvVar9 = &local_30;
        (**(code **)*puVar12)(puVar12,local_120,pvVar9,iVar3,1,1,pvVar9);
        uVar10 = (undefined4)((ulong)pvVar9 >> 0x20);
        core::string<wchar_t>::~string((string<wchar_t> *)0x3d0fe9);
        local_44 = *(int *)(in_RDI + 0x40);
        local_3c = local_50 + -1;
        local_40 = local_30.Y + -1;
        local_38 = local_30.Y;
        in_stack_fffffffffffffe80 = local_20;
        uVar4 = (**(code **)*local_10)(local_10,0);
        (*(in_stack_fffffffffffffe80->super_IEventReceiver)._vptr_IEventReceiver[0x33])
                  (in_stack_fffffffffffffe80,(ulong)uVar4,&local_44,in_RDI + 0x50);
        pIVar11 = local_20;
        local_44 = local_54;
        local_3c = *(undefined4 *)(in_RDI + 0x48);
        uVar4 = (**(code **)*local_10)(local_10,0);
        (*(pIVar11->super_IEventReceiver)._vptr_IEventReceiver[0x33])
                  (pIVar11,(ulong)uVar4,&local_44,in_RDI + 0x50);
      }
      uVar6 = (ulong)(*(byte *)(in_RDI + 0x15d) & 1);
      (**(code **)(*local_10 + 0x98))
                (local_10,in_RDI,*(byte *)(in_RDI + 0x15c) & 1,uVar6,in_RDI + 0x40,in_RDI + 0x50,
                 CONCAT44(uVar10,*(undefined4 *)(in_RDI + 0x160)),*(undefined4 *)(in_RDI + 0x164));
      uVar7 = extraout_RDX;
      if (*(long *)(in_RDI + 0x168) != 0) {
        uVar6 = CONCAT71((int7)(uVar6 >> 8),local_49) & 0xffffffffffffff01;
        (**(code **)(**(long **)(in_RDI + 0x168) + 0x98))
                  (*(long **)(in_RDI + 0x168),local_49 & 1,extraout_RDX,uVar6);
        uVar7 = extraout_RDX_00;
      }
      if (*(long *)(in_RDI + 0x170) != 0) {
        (**(code **)(**(long **)(in_RDI + 0x170) + 0x98))
                  (*(long **)(in_RDI + 0x170),local_4a & 1,uVar7,
                   CONCAT71((int7)(uVar6 >> 8),local_4a) & 0xffffffffffffff01);
      }
      refreshSprites((CGUITabControl *)CONCAT44(in_stack_fffffffffffffeb4,uVar13));
      IGUIElement::draw(in_stack_fffffffffffffe80);
    }
  }
  return;
}

Assistant:

void CGUITabControl::draw()
{
	if (!IsVisible)
		return;

	IGUISkin *skin = Environment->getSkin();
	if (!skin)
		return;

	IGUIFont *font = skin->getFont();
	video::IVideoDriver *driver = Environment->getVideoDriver();

	core::rect<s32> frameRect(AbsoluteRect);

	// some empty background as placeholder when there are no tabs
	if (Tabs.empty())
		driver->draw2DRectangle(skin->getColor(EGDC_3D_HIGH_LIGHT), frameRect, &AbsoluteClippingRect);

	if (!font)
		return;

	// tab button bar can be above or below the tabs
	if (VerticalAlignment == EGUIA_UPPERLEFT) {
		frameRect.UpperLeftCorner.Y += 2;
		frameRect.LowerRightCorner.Y = frameRect.UpperLeftCorner.Y + TabHeight;
	} else {
		frameRect.UpperLeftCorner.Y = frameRect.LowerRightCorner.Y - TabHeight - 1;
		frameRect.LowerRightCorner.Y -= 2;
	}

	core::rect<s32> tr;
	s32 pos = frameRect.UpperLeftCorner.X + 2;

	bool needLeftScroll = CurrentScrollTabIndex > 0;
	bool needRightScroll = false;

	// left and right pos of the active tab
	s32 left = 0;
	s32 right = 0;

	// const wchar_t* activetext = 0;
	IGUITab *activeTab = 0;

	// Draw all tab-buttons except the active one
	for (u32 i = CurrentScrollTabIndex; i < Tabs.size() && !needRightScroll; ++i) {
		// get Text
		const wchar_t *text = 0;
		if (Tabs[i])
			text = Tabs[i]->getText();

		// get text length
		s32 len = calcTabWidth(font, text);
		if (ScrollControl) {
			s32 space = UpButton->getAbsolutePosition().UpperLeftCorner.X - 2 - pos;
			if (space < len) {
				needRightScroll = true;
				len = space;
			}
		}

		frameRect.LowerRightCorner.X += len;
		frameRect.UpperLeftCorner.X = pos;
		frameRect.LowerRightCorner.X = frameRect.UpperLeftCorner.X + len;

		pos += len;

		if ((s32)i == ActiveTabIndex) {
			// for active button just remember values
			left = frameRect.UpperLeftCorner.X;
			right = frameRect.LowerRightCorner.X;
			// activetext = text;
			activeTab = Tabs[i];
		} else {
			skin->draw3DTabButton(this, false, frameRect, &AbsoluteClippingRect, VerticalAlignment);

			// draw text
			core::rect<s32> textClipRect(frameRect); // TODO: exact size depends on borders in draw3DTabButton which we don't get with current interface
			textClipRect.clipAgainst(AbsoluteClippingRect);
			font->draw(text, frameRect, Tabs[i]->getTextColor(),
					true, true, &textClipRect);
		}
	}

	// Draw active tab button
	// Drawn later than other buttons because it draw over the buttons before/after it.
	if (left != 0 && right != 0 && activeTab != 0) {
		// draw upper highlight frame
		if (VerticalAlignment == EGUIA_UPPERLEFT) {
			frameRect.UpperLeftCorner.X = left - 2;
			frameRect.LowerRightCorner.X = right + 2;
			frameRect.UpperLeftCorner.Y -= 2;

			skin->draw3DTabButton(this, true, frameRect, &AbsoluteClippingRect, VerticalAlignment);

			// draw text
			core::rect<s32> textClipRect(frameRect); // TODO: exact size depends on borders in draw3DTabButton which we don't get with current interface
			textClipRect.clipAgainst(AbsoluteClippingRect);
			font->draw(activeTab->getText(), frameRect, activeTab->getTextColor(),
					true, true, &textClipRect);

			tr.UpperLeftCorner.X = AbsoluteRect.UpperLeftCorner.X;
			tr.LowerRightCorner.X = left - 1;
			tr.UpperLeftCorner.Y = frameRect.LowerRightCorner.Y - 1;
			tr.LowerRightCorner.Y = frameRect.LowerRightCorner.Y;
			driver->draw2DRectangle(skin->getColor(EGDC_3D_HIGH_LIGHT), tr, &AbsoluteClippingRect);

			tr.UpperLeftCorner.X = right;
			tr.LowerRightCorner.X = AbsoluteRect.LowerRightCorner.X;
			driver->draw2DRectangle(skin->getColor(EGDC_3D_HIGH_LIGHT), tr, &AbsoluteClippingRect);
		} else {
			frameRect.UpperLeftCorner.X = left - 2;
			frameRect.LowerRightCorner.X = right + 2;
			frameRect.LowerRightCorner.Y += 2;

			skin->draw3DTabButton(this, true, frameRect, &AbsoluteClippingRect, VerticalAlignment);

			// draw text
			font->draw(activeTab->getText(), frameRect, activeTab->getTextColor(),
					true, true, &frameRect);

			tr.UpperLeftCorner.X = AbsoluteRect.UpperLeftCorner.X;
			tr.LowerRightCorner.X = left - 1;
			tr.UpperLeftCorner.Y = frameRect.UpperLeftCorner.Y - 1;
			tr.LowerRightCorner.Y = frameRect.UpperLeftCorner.Y;
			driver->draw2DRectangle(skin->getColor(EGDC_3D_DARK_SHADOW), tr, &AbsoluteClippingRect);

			tr.UpperLeftCorner.X = right;
			tr.LowerRightCorner.X = AbsoluteRect.LowerRightCorner.X;
			driver->draw2DRectangle(skin->getColor(EGDC_3D_DARK_SHADOW), tr, &AbsoluteClippingRect);
		}
	} else {
		// No active tab
		// Draw a line separating button bar from tab area
		tr.UpperLeftCorner.X = AbsoluteRect.UpperLeftCorner.X;
		tr.LowerRightCorner.X = AbsoluteRect.LowerRightCorner.X;
		tr.UpperLeftCorner.Y = frameRect.LowerRightCorner.Y - 1;
		tr.LowerRightCorner.Y = frameRect.LowerRightCorner.Y;

		if (VerticalAlignment == EGUIA_UPPERLEFT) {
			driver->draw2DRectangle(skin->getColor(EGDC_3D_HIGH_LIGHT), tr, &AbsoluteClippingRect);
		} else {
			tr.UpperLeftCorner.Y = frameRect.UpperLeftCorner.Y - 1;
			tr.LowerRightCorner.Y = frameRect.UpperLeftCorner.Y;
			driver->draw2DRectangle(skin->getColor(EGDC_3D_DARK_SHADOW), tr, &AbsoluteClippingRect);
		}
	}

	// drawing some border and background for the tab-area.
	skin->draw3DTabBody(this, Border, FillBackground, AbsoluteRect, &AbsoluteClippingRect, TabHeight, VerticalAlignment);

	// enable scrollcontrols on need
	if (UpButton)
		UpButton->setEnabled(needLeftScroll);
	if (DownButton)
		DownButton->setEnabled(needRightScroll);
	refreshSprites();

	IGUIElement::draw();
}